

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

void __thiscall Json::StyledWriter::writeValue(StyledWriter *this,Value *value)

{
  bool bVar1;
  ValueType VVar2;
  Json *pJVar3;
  Value *pVVar4;
  bool value_00;
  char *value_01;
  LargestUInt value_02;
  char *value_03;
  LargestInt value_04;
  pointer key;
  double value_05;
  allocator local_69;
  string local_68;
  Members members;
  
  pVVar4 = value;
  VVar2 = Value::type(value);
  switch(VVar2) {
  case nullValue:
    std::__cxx11::string::string((string *)&local_68,"null",(allocator *)&members);
    pushValue(this,&local_68);
    break;
  case intValue:
    pJVar3 = (Json *)Value::asLargestInt(value);
    valueToString_abi_cxx11_(&local_68,pJVar3,value_04);
    pushValue(this,&local_68);
    break;
  case uintValue:
    pJVar3 = (Json *)Value::asLargestUInt(value);
    valueToString_abi_cxx11_(&local_68,pJVar3,value_02);
    pushValue(this,&local_68);
    break;
  case realValue:
    value_05 = Value::asDouble(value);
    valueToString_abi_cxx11_(&local_68,(Json *)pVVar4,value_05);
    pushValue(this,&local_68);
    break;
  case stringValue:
    pJVar3 = (Json *)Value::asCString(value);
    valueToQuotedString_abi_cxx11_(&local_68,pJVar3,value_01);
    pushValue(this,&local_68);
    break;
  case booleanValue:
    bVar1 = Value::asBool(value);
    valueToString_abi_cxx11_(&local_68,(Json *)(ulong)bVar1,value_00);
    pushValue(this,&local_68);
    break;
  case arrayValue:
    writeArrayValue(this,value);
    return;
  case objectValue:
    Value::getMemberNames_abi_cxx11_(&members,value);
    if (members.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        members.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string((string *)&local_68,"{}",&local_69);
      pushValue(this,&local_68);
    }
    else {
      std::__cxx11::string::string((string *)&local_68,"{",&local_69);
      writeWithIndent(this,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      indent(this);
      key = members.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        pVVar4 = Value::operator[](value,key);
        writeCommentBeforeValue(this,pVVar4);
        valueToQuotedString_abi_cxx11_(&local_68,(Json *)(key->_M_dataplus)._M_p,value_03);
        writeWithIndent(this,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::append((char *)&this->document_);
        writeValue(this,pVVar4);
        key = key + 1;
        if (key == members.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) break;
        std::__cxx11::string::push_back((char)&this->document_);
        writeCommentAfterValueOnSameLine(this,pVVar4);
      }
      writeCommentAfterValueOnSameLine(this,pVVar4);
      unindent(this);
      std::__cxx11::string::string((string *)&local_68,"}",&local_69);
      writeWithIndent(this,&local_68);
    }
    std::__cxx11::string::~string((string *)&local_68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&members);
  default:
    goto switchD_004e4f43_default;
  }
  std::__cxx11::string::~string((string *)&local_68);
switchD_004e4f43_default:
  return;
}

Assistant:

void StyledWriter::writeValue(const Value& value) {
  switch (value.type()) {
  case nullValue:
    pushValue("null");
    break;
  case intValue:
    pushValue(valueToString(value.asLargestInt()));
    break;
  case uintValue:
    pushValue(valueToString(value.asLargestUInt()));
    break;
  case realValue:
    pushValue(valueToString(value.asDouble()));
    break;
  case stringValue:
    pushValue(valueToQuotedString(value.asCString()));
    break;
  case booleanValue:
    pushValue(valueToString(value.asBool()));
    break;
  case arrayValue:
    writeArrayValue(value);
    break;
  case objectValue: {
    Value::Members members(value.getMemberNames());
    if (members.empty())
      pushValue("{}");
    else {
      writeWithIndent("{");
      indent();
      Value::Members::iterator it = members.begin();
      for (;;) {
        const std::string& name = *it;
        const Value& childValue = value[name];
        writeCommentBeforeValue(childValue);
        writeWithIndent(valueToQuotedString(name.c_str()));
        document_ += " : ";
        writeValue(childValue);
        if (++it == members.end()) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        document_ += ',';
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("}");
    }
  } break;
  }
}